

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t uloc_kw_countKeywords(UEnumeration *en,UErrorCode *param_2)

{
  size_t sVar1;
  int iVar2;
  char *__s;
  
  iVar2 = 0;
  for (__s = *en->context; *__s != '\0'; __s = __s + sVar1 + 1) {
    iVar2 = iVar2 + 1;
    sVar1 = strlen(__s);
  }
  return iVar2;
}

Assistant:

static int32_t U_CALLCONV
uloc_kw_countKeywords(UEnumeration *en, UErrorCode * /*status*/) {
    char *kw = ((UKeywordsContext *)en->context)->keywords;
    int32_t result = 0;
    while(*kw) {
        result++;
        kw += uprv_strlen(kw)+1;
    }
    return result;
}